

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_mime_message.c
# Opt level: O1

void usage(void)

{
  putchar(10);
  puts("libcmime - simple api demonstration");
  puts("-----------------------------------");
  puts("demonstrates: manual creation of new CMimeMessage_T mime message");
  puts(
      "output: output is written to stdout if no output file is specified (-f /path/to/out_file.txt)"
      );
  putchar(10);
  exit(0);
}

Assistant:

void usage() {
    printf("\n");
    printf("libcmime - simple api demonstration\n");
    printf("-----------------------------------\n");
    printf("demonstrates: manual creation of new CMimeMessage_T mime message\n");
    printf("output: output is written to stdout if no output file is specified (-f /path/to/out_file.txt)\n");
    printf("\n");
    exit(0);
}